

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_streamable<trng::negative_binomial_dist>(negative_binomial_dist *d)

{
  StringRef capturedExpression;
  ExprLhs<const_trng::negative_binomial_dist_&> this;
  negative_binomial_dist *in_RDI;
  AssertionHandler catchAssertionHandler;
  negative_binomial_dist d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd38;
  Flags in_stack_fffffffffffffd3c;
  SourceLineInfo *in_stack_fffffffffffffd40;
  SourceLineInfo *this_00;
  AssertionHandler *this_01;
  param_type *in_stack_fffffffffffffd58;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd60;
  negative_binomial_dist *in_stack_fffffffffffffd70;
  ExprLhs<const_trng::negative_binomial_dist_&> *in_stack_fffffffffffffd78;
  param_type *in_stack_fffffffffffffd98;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffda0;
  SourceLineInfo local_258;
  StringRef local_248;
  stringstream local_1b8 [16];
  AssertionHandler local_1a8 [5];
  negative_binomial_dist *local_8;
  
  local_8 = in_RDI;
  trng::negative_binomial_dist::param_type::param_type((param_type *)0x38a7ec);
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_01 = local_1a8;
  trng::negative_binomial_dist::param(local_8);
  trng::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  trng::operator>>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  trng::negative_binomial_dist::negative_binomial_dist
            ((negative_binomial_dist *)in_stack_fffffffffffffd40,
             (param_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  local_248 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd40,
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  this_00 = &local_258;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x127);
  Catch::StringRef::StringRef((StringRef *)this_01,(char *)this_00);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd60;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffd58;
  Catch::AssertionHandler::AssertionHandler
            (this_01,(StringRef *)this_00,in_stack_fffffffffffffd40,capturedExpression,
             in_stack_fffffffffffffd3c);
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                    (negative_binomial_dist *)0x38a8df);
  Catch::ExprLhs<trng::negative_binomial_dist_const&>::operator==
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  Catch::BinaryExpr<const_trng::negative_binomial_dist_&,_const_trng::negative_binomial_dist_&>::
  ~BinaryExpr((BinaryExpr<const_trng::negative_binomial_dist_&,_const_trng::negative_binomial_dist_&>
               *)0x38a927);
  Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  trng::negative_binomial_dist::~negative_binomial_dist((negative_binomial_dist *)0x38a9fb);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  trng::negative_binomial_dist::param_type::~param_type((param_type *)0x38aa15);
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}